

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeymapper.cpp
# Opt level: O0

void * __thiscall QKeyMapper::resolveInterface(QKeyMapper *this,char *name,int revision)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  QPlatformIntegration *pQVar5;
  uint in_EDX;
  char *in_RSI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_4;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_fffffffffffffe88;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  uint in_stack_fffffffffffffe9c;
  QMessageLogger *in_stack_fffffffffffffea0;
  QDebug *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffed8;
  void *local_108;
  char local_100 [32];
  char local_e0 [64];
  QDebug local_a0;
  char local_98 [32];
  char local_78 [32];
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::lcNativeInterface();
  anon_unknown.dwarf_568c80::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_568c80::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x3a9e9d);
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffea0,
               (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),(char *)in_stack_fffffffffffffe88,
               (char *)0x3a9eb6);
    in_stack_fffffffffffffed8 = in_RSI;
    pcVar4 = QNativeInterface::Private::TypeInfo<QNativeInterface::Private::QEvdevKeyMapper>::name()
    ;
    QMessageLogger::debug
              (local_78,"Comparing requested interface name %s with available %s",
               in_stack_fffffffffffffed8,pcVar4);
    local_10 = 0;
  }
  pcVar4 = QNativeInterface::Private::TypeInfo<QNativeInterface::Private::QEvdevKeyMapper>::name();
  iVar2 = qstrcmp(in_RSI,pcVar4);
  if (iVar2 == 0) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcNativeInterface();
    anon_unknown.dwarf_568c80::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
      anon_unknown.dwarf_568c80::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x3a9f65);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffea0,
                 (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),(char *)in_stack_fffffffffffffe88,
                 (char *)0x3a9f7e);
      uVar3 = QNativeInterface::Private::TypeInfo<QNativeInterface::Private::QEvdevKeyMapper>::
              revision();
      QMessageLogger::debug
                (local_98,
                 "Match for interface %s. Comparing revisions (requested %d / available %d)",in_RSI,
                 (ulong)in_EDX,(ulong)uVar3);
      local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
    }
    uVar3 = QNativeInterface::Private::TypeInfo<QNativeInterface::Private::QEvdevKeyMapper>::
            revision();
    if (in_EDX == uVar3) {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcNativeInterface();
      anon_unknown.dwarf_568c80::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
        anon_unknown.dwarf_568c80::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x3aa032);
        QMessageLogger::QMessageLogger
                  (in_stack_fffffffffffffea0,
                   (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                   (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),(char *)in_stack_fffffffffffffe88
                   ,(char *)0x3aa04b);
        QMessageLogger::debug();
        QDebug::operator<<(in_stack_fffffffffffffea8,in_stack_fffffffffffffed8);
        QGuiApplicationPrivate::platformIntegration();
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        QDebug::~QDebug(&local_a0);
        local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
      }
      pQVar5 = QGuiApplicationPrivate::platformIntegration();
      if (pQVar5 == (QPlatformIntegration *)0x0) {
        local_108 = (void *)0x0;
      }
      else {
        local_108 = (void *)__dynamic_cast(pQVar5,&QPlatformIntegration::typeinfo,
                                           &QNativeInterface::Private::QEvdevKeyMapper::typeinfo,
                                           0xfffffffffffffffe);
      }
    }
    else {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcNativeInterface();
      anon_unknown.dwarf_568c80::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe88);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_48), bVar1) {
        anon_unknown.dwarf_568c80::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3aa146);
        QMessageLogger::QMessageLogger
                  (in_stack_fffffffffffffea0,
                   (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                   (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),(char *)in_stack_fffffffffffffe88
                   ,(char *)0x3aa15f);
        in_stack_fffffffffffffe9c = in_EDX;
        uVar3 = QNativeInterface::Private::TypeInfo<QNativeInterface::Private::QEvdevKeyMapper>::
                revision();
        QMessageLogger::warning
                  (local_e0,
                   "Native interface revision mismatch (requested %d / available %d) for interface %s"
                   ,(ulong)in_stack_fffffffffffffe9c,(ulong)uVar3,in_RSI);
        local_40 = (undefined1 *)((ulong)local_40 & 0xffffffffffffff00);
      }
      local_108 = (void *)0x0;
    }
  }
  else {
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcNativeInterface();
    anon_unknown.dwarf_568c80::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_58), bVar1) {
      anon_unknown.dwarf_568c80::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x3aa1f8);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffea0,
                 (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),(char *)in_stack_fffffffffffffe88,
                 (char *)0x3aa20e);
      QMessageLogger::debug(local_100,"No match for requested interface name %s",in_RSI);
      local_50 = (undefined1 *)((ulong)local_50 & 0xffffffffffffff00);
    }
    local_108 = (void *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_108;
}

Assistant:

void *QKeyMapper::resolveInterface(const char *name, int revision) const
{
    Q_UNUSED(name); Q_UNUSED(revision);
    using namespace QNativeInterface::Private;

#if QT_CONFIG(evdev)
    QT_NATIVE_INTERFACE_RETURN_IF(QEvdevKeyMapper, QGuiApplicationPrivate::platformIntegration());
#endif

#if QT_CONFIG(vxworksevdev)
    QT_NATIVE_INTERFACE_RETURN_IF(QVxKeyMapper, QGuiApplicationPrivate::platformIntegration());
#endif

    return nullptr;
}